

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3GetToken(uchar *z,int *tokenType)

{
  uchar *puVar1;
  uchar uVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  
  bVar6 = *z;
  switch(bVar6) {
  case 0x20:
    goto switchD_0013e8e3_caseD_20;
  case 0x21:
    if (z[1] == '=') {
LAB_0013ed64:
      *tokenType = 0x4e;
    }
    else {
      *tokenType = 0x96;
    }
    goto LAB_0013ee1c;
  case 0x22:
  case 0x27:
  case 0x60:
    bVar7 = z[1];
    bVar13 = bVar7 == 0;
    if (bVar13) {
      bVar14 = false;
      uVar11 = 1;
    }
    else {
      uVar11 = 1;
      do {
        iVar3 = (int)uVar11;
        if (bVar7 == bVar6) {
          if (z[(long)iVar3 + 1] != bVar6) break;
          iVar3 = iVar3 + 1;
        }
        bVar7 = z[(long)iVar3 + 1];
        uVar11 = (long)iVar3 + 1;
        bVar13 = bVar7 == 0;
      } while (!bVar13);
      bVar14 = bVar7 == 0x27;
    }
    uVar10 = (uint)uVar11;
    if (bVar14) {
      *tokenType = 0x61;
      goto LAB_0013ed5c;
    }
    if (!bVar13) {
      *tokenType = 0x1b;
      goto LAB_0013ed5c;
    }
    goto LAB_0013eb92;
  case 0x23:
  case 0x24:
  case 0x3a:
  case 0x40:
    *tokenType = 0x87;
    bVar6 = z[1];
    uVar11 = 1;
    if (bVar6 == 0) {
      bVar13 = true;
    }
    else {
      iVar3 = 0;
      do {
        iVar8 = (int)uVar11;
        if ((""[bVar6] & 0x46) == 0) {
          if (0 < iVar3 && bVar6 == 0x28) {
            uVar10 = iVar8 + 1;
            pbVar5 = z + iVar8;
            goto LAB_0013edc5;
          }
          if ((bVar6 != 0x3a) || (z[(long)iVar8 + 1] != ':')) break;
          iVar8 = iVar8 + 1;
        }
        else {
          iVar3 = iVar3 + 1;
        }
        bVar6 = z[(long)iVar8 + 1];
        uVar11 = (long)iVar8 + 1;
      } while (bVar6 != 0);
      bVar13 = iVar3 == 0;
    }
    goto LAB_0013eb69;
  case 0x25:
    *tokenType = 0x5d;
    break;
  case 0x26:
    *tokenType = 0x55;
    break;
  case 0x28:
    *tokenType = 0x16;
    break;
  case 0x29:
    *tokenType = 0x17;
    break;
  case 0x2a:
    *tokenType = 0x5b;
    break;
  case 0x2b:
    *tokenType = 0x59;
    break;
  case 0x2c:
    *tokenType = 0x1a;
    break;
  case 0x2d:
    if (z[1] != '-') {
      *tokenType = 0x5a;
      break;
    }
    for (uVar11 = 2; (z[uVar11] != '\0' && (z[uVar11] != '\n')); uVar11 = uVar11 + 1) {
    }
    goto LAB_0013ea0d;
  case 0x2e:
    if (0xfffffffffffffff5 < (ulong)z[1] - 0x3a) goto switchD_0013e8e3_caseD_30;
    *tokenType = 0x7a;
    break;
  case 0x2f:
    if ((z[1] == '*') && (uVar2 = z[2], uVar2 != '\0')) {
      lVar12 = 3;
      do {
        lVar4 = lVar12;
        if ((uVar2 == '*') && (z[lVar4] == '/')) {
          iVar3 = 1;
          goto LAB_0013ee40;
        }
        uVar2 = z[lVar4];
        lVar12 = lVar4 + 1;
      } while (uVar2 != '\0');
      iVar3 = 0;
LAB_0013ee40:
      uVar11 = (ulong)(uint)((int)lVar4 + iVar3);
      goto LAB_0013ea0d;
    }
    *tokenType = 0x5c;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
switchD_0013e8e3_caseD_30:
    *tokenType = 0x84;
    if (((*z == '0') && ((z[1] | 0x20) == 0x78)) && ((""[z[2]] & 8) != 0)) {
      lVar12 = 3;
      do {
        pbVar5 = z + lVar12;
        lVar12 = lVar12 + 1;
      } while ((""[*pbVar5] & 8) != 0);
      uVar11 = (ulong)((int)lVar12 - 1);
    }
    else {
      uVar11 = 0xffffffffffffffff;
      do {
        lVar12 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while (0xfffffffffffffff5 < (ulong)z[lVar12] - 0x3a);
      if (z[lVar12] == 0x2e) {
        do {
          lVar12 = uVar11 + 1;
          uVar11 = uVar11 + 1;
        } while (0xfffffffffffffff5 < (ulong)z[lVar12] - 0x3a);
        *tokenType = 0x85;
      }
      iVar3 = (int)uVar11;
      if (((z[iVar3] | 0x20) == 0x65) &&
         ((bVar6 = z[(long)iVar3 + 1], 0xfffffffffffffff5 < (ulong)bVar6 - 0x3a ||
          (((bVar6 == 0x2d || (bVar6 == 0x2b)) &&
           (0xfffffffffffffff5 < (ulong)z[(long)iVar3 + 2] - 0x3a)))))) {
        uVar11 = (long)(iVar3 + 2) - 1;
        do {
          lVar12 = uVar11 + 1;
          uVar11 = uVar11 + 1;
        } while (0xfffffffffffffff5 < (ulong)z[lVar12] - 0x3a);
        *tokenType = 0x85;
      }
      if ((""[z[(int)uVar11]] & 0x46) != 0) {
        pbVar5 = z + (int)uVar11;
        do {
          pbVar5 = pbVar5 + 1;
          *tokenType = 0x96;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while ((""[*pbVar5] & 0x46) != 0);
      }
    }
    goto LAB_0013ee30;
  case 0x3b:
    *tokenType = 1;
    break;
  case 0x3c:
    uVar2 = z[1];
    if (uVar2 == '<') {
      *tokenType = 0x57;
    }
    else {
      if (uVar2 == '>') goto LAB_0013ed64;
      if (uVar2 != '=') {
        *tokenType = 0x52;
        break;
      }
      *tokenType = 0x51;
    }
    goto LAB_0013ee1c;
  case 0x3d:
    *tokenType = 0x4f;
    uVar10 = (uint)(z[1] == '=');
LAB_0013ed5c:
    uVar11 = (ulong)(uVar10 + 1);
    goto LAB_0013ee30;
  case 0x3e:
    if (z[1] == '>') {
      *tokenType = 0x58;
    }
    else {
      if (z[1] != '=') {
        *tokenType = 0x50;
        break;
      }
      *tokenType = 0x53;
    }
    goto LAB_0013ee1c;
  case 0x3f:
    *tokenType = 0x87;
    uVar11 = 0;
    do {
      lVar12 = uVar11 + 1;
      uVar11 = uVar11 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar12] - 0x3a);
    goto LAB_0013ee30;
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7d:
    goto switchD_0013e8e3_caseD_41;
  case 0x58:
  case 0x78:
    if (z[1] == '\'') {
      *tokenType = 0x86;
      uVar11 = 1;
      do {
        lVar12 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while ((""[z[lVar12]] & 8) != 0);
      if ((uVar11 & 1) != 0 || z[lVar12] != 0x27) {
        *tokenType = 0x96;
        for (; (z[uVar11] != '\0' && (z[uVar11] != '\'')); uVar11 = uVar11 + 1) {
        }
      }
      uVar11 = (ulong)(((int)uVar11 + 1) - (uint)(z[(int)uVar11] == '\0'));
      goto LAB_0013ee30;
    }
switchD_0013e8e3_caseD_41:
    if ((""[bVar6] & 0x46) != 0) {
      uVar11 = 0;
      do {
        lVar12 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while ((""[z[lVar12]] & 0x46) != 0);
      iVar3 = keywordCode((char *)z,(int)uVar11);
LAB_0013ed7f:
      *tokenType = iVar3;
      goto LAB_0013ee30;
    }
    *tokenType = 0x96;
    break;
  case 0x5b:
    uVar11 = 1;
    do {
      puVar1 = z + uVar11;
      if (*puVar1 == '\0') {
        iVar3 = 0x96;
        goto LAB_0013ed7f;
      }
      uVar11 = uVar11 + 1;
    } while (*puVar1 != ']');
    iVar3 = 0x1b;
    goto LAB_0013ed7f;
  case 0x7c:
    if (z[1] != '|') {
      *tokenType = 0x56;
      break;
    }
    *tokenType = 0x5e;
LAB_0013ee1c:
    uVar11 = 2;
    goto LAB_0013ee30;
  case 0x7e:
    *tokenType = 0x60;
    break;
  default:
    if ((0xd < bVar6) || ((0x3600U >> (bVar6 & 0x1f) & 1) == 0)) goto switchD_0013e8e3_caseD_41;
    goto switchD_0013e8e3_caseD_20;
  }
  uVar11 = 1;
LAB_0013ee30:
  return (int)uVar11;
  while ((uVar10 = uVar10 + 1, uVar9 != 0x29 && ((""[uVar9] & 1) == 0))) {
LAB_0013edc5:
    pbVar5 = pbVar5 + 1;
    uVar11 = (ulong)uVar10;
    uVar9 = (ulong)*pbVar5;
    if (uVar9 == 0) goto LAB_0013edf9;
  }
  if (*pbVar5 == 0x29) {
    bVar13 = false;
    uVar11 = (ulong)uVar10;
  }
  else {
LAB_0013edf9:
    *tokenType = 0x96;
    bVar13 = false;
  }
LAB_0013eb69:
  if (!bVar13) goto LAB_0013ee30;
LAB_0013eb92:
  *tokenType = 0x96;
  goto LAB_0013ee30;
switchD_0013e8e3_caseD_20:
  uVar11 = 0;
  do {
    lVar12 = uVar11 + 1;
    uVar11 = uVar11 + 1;
  } while ((""[z[lVar12]] & 1) != 0);
LAB_0013ea0d:
  *tokenType = 0x97;
  goto LAB_0013ee30;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetToken(const unsigned char *z, int *tokenType){
  int i, c;
  switch( *z ){
    case ' ': case '\t': case '\n': case '\f': case '\r': {
      testcase( z[0]==' ' );
      testcase( z[0]=='\t' );
      testcase( z[0]=='\n' );
      testcase( z[0]=='\f' );
      testcase( z[0]=='\r' );
      for(i=1; sqlite3Isspace(z[i]); i++){}
      *tokenType = TK_SPACE;
      return i;
    }
    case '-': {
      if( z[1]=='-' ){
        for(i=2; (c=z[i])!=0 && c!='\n'; i++){}
        *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
        return i;
      }
      *tokenType = TK_MINUS;
      return 1;
    }
    case '(': {
      *tokenType = TK_LP;
      return 1;
    }
    case ')': {
      *tokenType = TK_RP;
      return 1;
    }
    case ';': {
      *tokenType = TK_SEMI;
      return 1;
    }
    case '+': {
      *tokenType = TK_PLUS;
      return 1;
    }
    case '*': {
      *tokenType = TK_STAR;
      return 1;
    }
    case '/': {
      if( z[1]!='*' || z[2]==0 ){
        *tokenType = TK_SLASH;
        return 1;
      }
      for(i=3, c=z[2]; (c!='*' || z[i]!='/') && (c=z[i])!=0; i++){}
      if( c ) i++;
      *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
      return i;
    }
    case '%': {
      *tokenType = TK_REM;
      return 1;
    }
    case '=': {
      *tokenType = TK_EQ;
      return 1 + (z[1]=='=');
    }
    case '<': {
      if( (c=z[1])=='=' ){
        *tokenType = TK_LE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_NE;
        return 2;
      }else if( c=='<' ){
        *tokenType = TK_LSHIFT;
        return 2;
      }else{
        *tokenType = TK_LT;
        return 1;
      }
    }
    case '>': {
      if( (c=z[1])=='=' ){
        *tokenType = TK_GE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_RSHIFT;
        return 2;
      }else{
        *tokenType = TK_GT;
        return 1;
      }
    }
    case '!': {
      if( z[1]!='=' ){
        *tokenType = TK_ILLEGAL;
        return 2;
      }else{
        *tokenType = TK_NE;
        return 2;
      }
    }
    case '|': {
      if( z[1]!='|' ){
        *tokenType = TK_BITOR;
        return 1;
      }else{
        *tokenType = TK_CONCAT;
        return 2;
      }
    }
    case ',': {
      *tokenType = TK_COMMA;
      return 1;
    }
    case '&': {
      *tokenType = TK_BITAND;
      return 1;
    }
    case '~': {
      *tokenType = TK_BITNOT;
      return 1;
    }
    case '`':
    case '\'':
    case '"': {
      int delim = z[0];
      testcase( delim=='`' );
      testcase( delim=='\'' );
      testcase( delim=='"' );
      for(i=1; (c=z[i])!=0; i++){
        if( c==delim ){
          if( z[i+1]==delim ){
            i++;
          }else{
            break;
          }
        }
      }
      if( c=='\'' ){
        *tokenType = TK_STRING;
        return i+1;
      }else if( c!=0 ){
        *tokenType = TK_ID;
        return i+1;
      }else{
        *tokenType = TK_ILLEGAL;
        return i;
      }
    }
    case '.': {
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( !sqlite3Isdigit(z[1]) )
#endif
      {
        *tokenType = TK_DOT;
        return 1;
      }
      /* If the next character is a digit, this is a floating point
      ** number that begins with ".".  Fall thru into the next case */
    }
    case '0': case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8': case '9': {
      testcase( z[0]=='0' );  testcase( z[0]=='1' );  testcase( z[0]=='2' );
      testcase( z[0]=='3' );  testcase( z[0]=='4' );  testcase( z[0]=='5' );
      testcase( z[0]=='6' );  testcase( z[0]=='7' );  testcase( z[0]=='8' );
      testcase( z[0]=='9' );
      *tokenType = TK_INTEGER;
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( z[0]=='0' && (z[1]=='x' || z[1]=='X') && sqlite3Isxdigit(z[2]) ){
        for(i=3; sqlite3Isxdigit(z[i]); i++){}
        return i;
      }
#endif
      for(i=0; sqlite3Isdigit(z[i]); i++){}
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( z[i]=='.' ){
        i++;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
      if( (z[i]=='e' || z[i]=='E') &&
           ( sqlite3Isdigit(z[i+1]) 
            || ((z[i+1]=='+' || z[i+1]=='-') && sqlite3Isdigit(z[i+2]))
           )
      ){
        i += 2;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
#endif
      while( IdChar(z[i]) ){
        *tokenType = TK_ILLEGAL;
        i++;
      }
      return i;
    }
    case '[': {
      for(i=1, c=z[0]; c!=']' && (c=z[i])!=0; i++){}
      *tokenType = c==']' ? TK_ID : TK_ILLEGAL;
      return i;
    }
    case '?': {
      *tokenType = TK_VARIABLE;
      for(i=1; sqlite3Isdigit(z[i]); i++){}
      return i;
    }
#ifndef SQLITE_OMIT_TCL_VARIABLE
    case '$':
#endif
    case '@':  /* For compatibility with MS SQL Server */
    case '#':
    case ':': {
      int n = 0;
      testcase( z[0]=='$' );  testcase( z[0]=='@' );
      testcase( z[0]==':' );  testcase( z[0]=='#' );
      *tokenType = TK_VARIABLE;
      for(i=1; (c=z[i])!=0; i++){
        if( IdChar(c) ){
          n++;
#ifndef SQLITE_OMIT_TCL_VARIABLE
        }else if( c=='(' && n>0 ){
          do{
            i++;
          }while( (c=z[i])!=0 && !sqlite3Isspace(c) && c!=')' );
          if( c==')' ){
            i++;
          }else{
            *tokenType = TK_ILLEGAL;
          }
          break;
        }else if( c==':' && z[i+1]==':' ){
          i++;
#endif
        }else{
          break;
        }
      }
      if( n==0 ) *tokenType = TK_ILLEGAL;
      return i;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case 'x': case 'X': {
      testcase( z[0]=='x' ); testcase( z[0]=='X' );
      if( z[1]=='\'' ){
        *tokenType = TK_BLOB;
        for(i=2; sqlite3Isxdigit(z[i]); i++){}
        if( z[i]!='\'' || i%2 ){
          *tokenType = TK_ILLEGAL;
          while( z[i] && z[i]!='\'' ){ i++; }
        }
        if( z[i] ) i++;
        return i;
      }
      /* Otherwise fall through to the next case */
    }
#endif
    default: {
      if( !IdChar(*z) ){
        break;
      }
      for(i=1; IdChar(z[i]); i++){}
      *tokenType = keywordCode((char*)z, i);
      return i;
    }
  }
  *tokenType = TK_ILLEGAL;
  return 1;
}